

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void SHA1_transform(uint32_t *state,uchar *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  u *block;
  uchar w [64];
  uint local_2c;
  uint local_28;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uchar *buffer_local;
  uint32_t *state_local;
  
  memcpy(&block,buffer,0x40);
  uVar4 = *state;
  uVar2 = state[1];
  uVar5 = state[2];
  uVar3 = state[3];
  if ((char)SHA1_transform::endianness_indicator == '\0') {
    uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + (uint)block + 0x5a827999 +
            (uVar4 << 5 | uVar4 >> 0x1b) + state[4];
    uVar2 = uVar2 << 0x1e | uVar2 >> 2;
    uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + block._4_4_ + 0x5a827999 +
            (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
    uVar4 = uVar4 << 0x1e | uVar4 >> 2;
    uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + w._0_4_ + 0x5a827999 +
            (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + w._4_4_ + 0x5a827999 +
            (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + w._8_4_ + 0x5a827999 +
            (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + w._12_4_ + 0x5a827999 +
            (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + w._16_4_ + 0x5a827999 +
            (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + w._20_4_ + 0x5a827999 +
            (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + w._24_4_ + 0x5a827999 +
            (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + w._28_4_ + 0x5a827999 +
            (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + w._32_4_ + 0x5a827999 +
            (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + w._36_4_ + 0x5a827999 +
            (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + w._40_4_ + 0x5a827999 +
            (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
    local_2c = uVar1 * 0x40000000 | uVar1 >> 2;
    uVar2 = (uVar3 & (local_2c ^ uVar4) ^ uVar4) + w._44_4_ + 0x5a827999 +
            (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
    local_28 = uVar3 * 0x40000000 | uVar3 >> 2;
    c = (uVar5 & (local_28 ^ local_2c) ^ local_2c) + w._48_4_ + 0x5a827999 +
        (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
    e = uVar5 * 0x40000000 | uVar5 >> 2;
    local_2c = (uVar2 & (e ^ local_28) ^ local_28) + w._52_4_ + 0x5a827999 + (c * 0x20 | c >> 0x1b)
               + local_2c;
    d = uVar2 * 0x40000000 | uVar2 >> 2;
  }
  else {
    block._0_4_ = (uint)block << 0x18 | (uint)block >> 8 & 0xff00ff00 |
                  ((uint)block & 0xff00) << 8 | (uint)block >> 0x18;
    uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + (uint)block + 0x5a827999 +
            (uVar4 << 5 | uVar4 >> 0x1b) + state[4];
    uVar2 = uVar2 << 0x1e | uVar2 >> 2;
    block._4_4_ = block._4_4_ << 0x18 | block._4_4_ >> 8 & 0xff00ff00 |
                  (block._4_4_ & 0xff00) << 8 | block._4_4_ >> 0x18;
    uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + block._4_4_ + 0x5a827999 +
            (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
    uVar4 = uVar4 << 0x1e | uVar4 >> 2;
    w._0_4_ = w._0_4_ << 0x18 | (uint)w._0_4_ >> 8 & 0xff00ff00 |
              (w._0_4_ & 0xff00) << 8 | (uint)w._0_4_ >> 0x18;
    uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + w._0_4_ + 0x5a827999 +
            (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    w._4_4_ = w._4_4_ << 0x18 | (uint)w._4_4_ >> 8 & 0xff00ff00 |
              (w._4_4_ & 0xff00) << 8 | (uint)w._4_4_ >> 0x18;
    uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + w._4_4_ + 0x5a827999 +
            (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    w._8_4_ = w._8_4_ << 0x18 | (uint)w._8_4_ >> 8 & 0xff00ff00 |
              (w._8_4_ & 0xff00) << 8 | (uint)w._8_4_ >> 0x18;
    uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + w._8_4_ + 0x5a827999 +
            (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    w._12_4_ = w._12_4_ << 0x18 | (uint)w._12_4_ >> 8 & 0xff00ff00 |
               (w._12_4_ & 0xff00) << 8 | (uint)w._12_4_ >> 0x18;
    uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + w._12_4_ + 0x5a827999 +
            (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    w._16_4_ = w._16_4_ << 0x18 | (uint)w._16_4_ >> 8 & 0xff00ff00 |
               (w._16_4_ & 0xff00) << 8 | (uint)w._16_4_ >> 0x18;
    uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + w._16_4_ + 0x5a827999 +
            (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    w._20_4_ = w._20_4_ << 0x18 | (uint)w._20_4_ >> 8 & 0xff00ff00 |
               (w._20_4_ & 0xff00) << 8 | (uint)w._20_4_ >> 0x18;
    uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + w._20_4_ + 0x5a827999 +
            (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
    uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
    w._24_4_ = w._24_4_ << 0x18 | (uint)w._24_4_ >> 8 & 0xff00ff00 |
               (w._24_4_ & 0xff00) << 8 | (uint)w._24_4_ >> 0x18;
    uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + w._24_4_ + 0x5a827999 +
            (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
    uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
    w._28_4_ = w._28_4_ << 0x18 | (uint)w._28_4_ >> 8 & 0xff00ff00 |
               (w._28_4_ & 0xff00) << 8 | (uint)w._28_4_ >> 0x18;
    uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + w._28_4_ + 0x5a827999 +
            (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
    uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
    w._32_4_ = w._32_4_ << 0x18 | (uint)w._32_4_ >> 8 & 0xff00ff00 |
               (w._32_4_ & 0xff00) << 8 | (uint)w._32_4_ >> 0x18;
    uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + w._32_4_ + 0x5a827999 +
            (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
    uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
    w._36_4_ = w._36_4_ << 0x18 | (uint)w._36_4_ >> 8 & 0xff00ff00 |
               (w._36_4_ & 0xff00) << 8 | (uint)w._36_4_ >> 0x18;
    uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + w._36_4_ + 0x5a827999 +
            (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
    uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
    w._40_4_ = w._40_4_ << 0x18 | (uint)w._40_4_ >> 8 & 0xff00ff00 |
               (w._40_4_ & 0xff00) << 8 | (uint)w._40_4_ >> 0x18;
    uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + w._40_4_ + 0x5a827999 +
            (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
    local_2c = uVar1 * 0x40000000 | uVar1 >> 2;
    w._44_4_ = w._44_4_ << 0x18 | (uint)w._44_4_ >> 8 & 0xff00ff00 |
               (w._44_4_ & 0xff00) << 8 | (uint)w._44_4_ >> 0x18;
    uVar2 = (uVar3 & (local_2c ^ uVar4) ^ uVar4) + w._44_4_ + 0x5a827999 +
            (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
    local_28 = uVar3 * 0x40000000 | uVar3 >> 2;
    w._48_4_ = w._48_4_ << 0x18 | (uint)w._48_4_ >> 8 & 0xff00ff00 |
               (w._48_4_ & 0xff00) << 8 | (uint)w._48_4_ >> 0x18;
    c = (uVar5 & (local_28 ^ local_2c) ^ local_2c) + w._48_4_ + 0x5a827999 +
        (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
    e = uVar5 * 0x40000000 | uVar5 >> 2;
    w._52_4_ = w._52_4_ << 0x18 | (uint)w._52_4_ >> 8 & 0xff00ff00 |
               (w._52_4_ & 0xff00) << 8 | (uint)w._52_4_ >> 0x18;
    local_2c = (uVar2 & (e ^ local_28) ^ local_28) + w._52_4_ + 0x5a827999 + (c * 0x20 | c >> 0x1b)
               + local_2c;
    d = uVar2 * 0x40000000 | uVar2 >> 2;
  }
  uVar6 = (w._44_4_ ^ w._24_4_ ^ w._0_4_ ^ (uint)block) << 1 |
          (w._44_4_ ^ w._24_4_ ^ w._0_4_ ^ (uint)block) >> 0x1f;
  local_28 = (c & (d ^ e) ^ e) + uVar6 + 0x5a827999 + (local_2c << 5 | local_2c >> 0x1b) + local_28;
  uVar5 = c << 0x1e | c >> 2;
  uVar7 = (w._48_4_ ^ w._28_4_ ^ w._4_4_ ^ block._4_4_) << 1 |
          (w._48_4_ ^ w._28_4_ ^ w._4_4_ ^ block._4_4_) >> 0x1f;
  uVar4 = (local_2c & (uVar5 ^ d) ^ d) + uVar7 + 0x5a827999 + (local_28 * 0x20 | local_28 >> 0x1b) +
          e;
  uVar3 = local_2c << 0x1e | local_2c >> 2;
  uVar8 = (w._52_4_ ^ w._32_4_ ^ w._8_4_ ^ w._0_4_) << 1 |
          (uint)(w._52_4_ ^ w._32_4_ ^ w._8_4_ ^ w._0_4_) >> 0x1f;
  uVar2 = (local_28 & (uVar3 ^ uVar5) ^ uVar5) + uVar8 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b)
          + d;
  uVar1 = local_28 * 0x40000000 | local_28 >> 2;
  uVar9 = (uVar6 ^ w._36_4_ ^ w._12_4_ ^ w._4_4_) << 1 |
          (uVar6 ^ w._36_4_ ^ w._12_4_ ^ w._4_4_) >> 0x1f;
  uVar5 = (uVar4 & (uVar1 ^ uVar3) ^ uVar3) + uVar9 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar10 = (uVar7 ^ w._40_4_ ^ w._16_4_ ^ w._8_4_) << 1 |
           (uVar7 ^ w._40_4_ ^ w._16_4_ ^ w._8_4_) >> 0x1f;
  uVar3 = (uVar2 ^ uVar4 ^ uVar1) + uVar10 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar11 = (uVar8 ^ w._44_4_ ^ w._20_4_ ^ w._12_4_) << 1 |
           (uVar8 ^ w._44_4_ ^ w._20_4_ ^ w._12_4_) >> 0x1f;
  uVar1 = (uVar5 ^ uVar2 ^ uVar4) + uVar11 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar12 = (uVar9 ^ w._48_4_ ^ w._24_4_ ^ w._16_4_) << 1 |
           (uVar9 ^ w._48_4_ ^ w._24_4_ ^ w._16_4_) >> 0x1f;
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + uVar12 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar13 = (uVar10 ^ w._52_4_ ^ w._28_4_ ^ w._20_4_) << 1 |
           (uVar10 ^ w._52_4_ ^ w._28_4_ ^ w._20_4_) >> 0x1f;
  uVar2 = (uVar1 ^ uVar3 ^ uVar5) + uVar13 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ w._32_4_ ^ w._24_4_) << 1 |
           (uVar11 ^ uVar6 ^ w._32_4_ ^ w._24_4_) >> 0x1f;
  uVar5 = (uVar4 ^ uVar1 ^ uVar3) + uVar14 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ w._36_4_ ^ w._28_4_) << 1 |
           (uVar12 ^ uVar7 ^ w._36_4_ ^ w._28_4_) >> 0x1f;
  uVar3 = (uVar2 ^ uVar4 ^ uVar1) + uVar15 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ w._40_4_ ^ w._32_4_) << 1 |
           (uVar13 ^ uVar8 ^ w._40_4_ ^ w._32_4_) >> 0x1f;
  uVar1 = (uVar5 ^ uVar2 ^ uVar4) + uVar16 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ w._44_4_ ^ w._36_4_) << 1 |
           (uVar14 ^ uVar9 ^ w._44_4_ ^ w._36_4_) >> 0x1f;
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + uVar17 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ w._48_4_ ^ w._40_4_) << 1 |
           (uVar15 ^ uVar10 ^ w._48_4_ ^ w._40_4_) >> 0x1f;
  uVar2 = (uVar1 ^ uVar3 ^ uVar5) + uVar18 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ w._52_4_ ^ w._44_4_) << 1 |
           (uVar16 ^ uVar11 ^ w._52_4_ ^ w._44_4_) >> 0x1f;
  uVar5 = (uVar4 ^ uVar1 ^ uVar3) + uVar19 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ w._48_4_) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ w._48_4_) >> 0x1f;
  uVar3 = (uVar2 ^ uVar4 ^ uVar1) + uVar20 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ w._52_4_) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ w._52_4_) >> 0x1f;
  uVar1 = (uVar5 ^ uVar2 ^ uVar4) + uVar21 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar2 = (uVar1 ^ uVar3 ^ uVar5) + uVar7 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar5 = (uVar4 ^ uVar1 ^ uVar3) + uVar8 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar3 = (uVar2 ^ uVar4 ^ uVar1) + uVar9 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar1 = (uVar5 ^ uVar2 ^ uVar4) + uVar10 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + uVar11 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar2 = (uVar1 ^ uVar3 ^ uVar5) + uVar12 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar5 = (uVar4 ^ uVar1 ^ uVar3) + uVar13 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar3 = ((uVar2 | uVar4) & uVar1 | uVar2 & uVar4) + uVar14 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar1 = ((uVar5 | uVar2) & uVar4 | uVar5 & uVar2) + uVar15 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar4 = ((uVar3 | uVar5) & uVar2 | uVar3 & uVar5) + uVar16 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar2 = ((uVar1 | uVar3) & uVar5 | uVar1 & uVar3) + uVar17 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar5 = ((uVar4 | uVar1) & uVar3 | uVar4 & uVar1) + uVar18 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar3 = ((uVar2 | uVar4) & uVar1 | uVar2 & uVar4) + uVar19 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar1 = ((uVar5 | uVar2) & uVar4 | uVar5 & uVar2) + uVar20 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar4 = ((uVar3 | uVar5) & uVar2 | uVar3 & uVar5) + uVar21 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar2 = ((uVar1 | uVar3) & uVar5 | uVar1 & uVar3) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar5 = ((uVar4 | uVar1) & uVar3 | uVar4 & uVar1) + uVar7 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar3 = ((uVar2 | uVar4) & uVar1 | uVar2 & uVar4) + uVar8 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar1 = ((uVar5 | uVar2) & uVar4 | uVar5 & uVar2) + uVar9 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar4 = ((uVar3 | uVar5) & uVar2 | uVar3 & uVar5) + uVar10 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar2 = ((uVar1 | uVar3) & uVar5 | uVar1 & uVar3) + uVar11 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar5 = ((uVar4 | uVar1) & uVar3 | uVar4 & uVar1) + uVar12 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar3 = ((uVar2 | uVar4) & uVar1 | uVar2 & uVar4) + uVar13 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar1 = ((uVar5 | uVar2) & uVar4 | uVar5 & uVar2) + uVar14 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar4 = ((uVar3 | uVar5) & uVar2 | uVar3 & uVar5) + uVar15 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar2 = ((uVar1 | uVar3) & uVar5 | uVar1 & uVar3) + uVar16 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar5 = ((uVar4 | uVar1) & uVar3 | uVar4 & uVar1) + uVar17 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar3 = (uVar2 ^ uVar4 ^ uVar1) + uVar18 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar1 = (uVar5 ^ uVar2 ^ uVar4) + uVar19 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + uVar20 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar2 = (uVar1 ^ uVar3 ^ uVar5) + uVar21 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar22 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar5 = (uVar4 ^ uVar1 ^ uVar3) + uVar22 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar23 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar3 = (uVar2 ^ uVar4 ^ uVar1) + uVar23 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar1 = (uVar5 ^ uVar2 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar22 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + uVar7 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar8 = (uVar23 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar23 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar2 = (uVar1 ^ uVar3 ^ uVar5) + uVar8 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar9 = (uVar6 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar6 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar5 = (uVar4 ^ uVar1 ^ uVar3) + uVar9 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar10 = (uVar7 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar7 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar3 = (uVar2 ^ uVar4 ^ uVar1) + uVar10 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar11 = (uVar8 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar8 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar1 = (uVar5 ^ uVar2 ^ uVar4) + uVar11 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar12 = (uVar9 ^ uVar22 ^ uVar16 ^ uVar14) << 1 | (uVar9 ^ uVar22 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar4 = (uVar3 ^ uVar5 ^ uVar2) + uVar12 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar13 = (uVar10 ^ uVar23 ^ uVar17 ^ uVar15) << 1 | (uVar10 ^ uVar23 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar2 = (uVar1 ^ uVar3 ^ uVar5) + uVar13 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar2;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar18 ^ uVar16) << 1 | (uVar11 ^ uVar6 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar5 = (uVar4 ^ uVar1 ^ uVar3) + uVar14 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar6 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar12 = (uVar12 ^ uVar7 ^ uVar19 ^ uVar17) << 1 | (uVar12 ^ uVar7 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar3 = (uVar2 ^ uVar6 ^ uVar1) + uVar12 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar3;
  uVar7 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar8 = (uVar13 ^ uVar8 ^ uVar20 ^ uVar18) << 1 | (uVar13 ^ uVar8 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar1 = (uVar5 ^ uVar7 ^ uVar6) + uVar8 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar1;
  uVar4 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (uVar3 ^ uVar4 ^ uVar7) +
          ((uVar14 ^ uVar9 ^ uVar21 ^ uVar19) << 1 | (uVar14 ^ uVar9 ^ uVar21 ^ uVar19) >> 0x1f) +
          -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar6;
  uVar2 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (uVar1 ^ uVar2 ^ uVar4) +
          ((uVar12 ^ uVar10 ^ uVar22 ^ uVar20) << 1 | (uVar12 ^ uVar10 ^ uVar22 ^ uVar20) >> 0x1f) +
          -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar7;
  uVar5 = uVar1 * 0x40000000 | uVar1 >> 2;
  *state = (uVar6 ^ uVar5 ^ uVar2) +
           ((uVar8 ^ uVar11 ^ uVar23 ^ uVar21) << 1 | (uVar8 ^ uVar11 ^ uVar23 ^ uVar21) >> 0x1f) +
           -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b) + uVar4 + *state;
  state[1] = uVar7 + state[1];
  state[2] = (uVar6 * 0x40000000 | uVar6 >> 2) + state[2];
  state[3] = uVar5 + state[3];
  state[4] = uVar2 + state[4];
  return;
}

Assistant:

static void SHA1_transform(uint32_t state[5], const unsigned char buffer[64]) {
    uint32_t a, b, c, d, e;

    typedef union {
        unsigned char c[64];
        uint32_t l[16];
    } u;

    unsigned char w[64];
    u *block = (u *) w;

    memcpy(block, buffer, 64);

    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];

    static uint32_t endianness_indicator = 0x1;
    if (((unsigned char *) &endianness_indicator)[0]) {
        R0A_L( 0);
        R0E_L( 1);
        R0D_L( 2);
        R0C_L( 3);
        R0B_L( 4);
        R0A_L( 5);
        R0E_L( 6);
        R0D_L( 7);
        R0C_L( 8);
        R0B_L( 9);
        R0A_L(10);
        R0E_L(11);
        R0D_L(12);
        R0C_L(13);
        R0B_L(14);
        R0A_L(15);
    } else {
        R0A_B( 0);
        R0E_B( 1);
        R0D_B( 2);
        R0C_B( 3);
        R0B_B( 4);
        R0A_B( 5);
        R0E_B( 6);
        R0D_B( 7);
        R0C_B( 8);
        R0B_B( 9);
        R0A_B(10);
        R0E_B(11);
        R0D_B(12);
        R0C_B(13);
        R0B_B(14);
        R0A_B(15);
    }
    R1E(16);
    R1D(17);
    R1C(18);
    R1B(19);
    R2A(20);
    R2E(21);
    R2D(22);
    R2C(23);
    R2B(24);
    R2A(25);
    R2E(26);
    R2D(27);
    R2C(28);
    R2B(29);
    R2A(30);
    R2E(31);
    R2D(32);
    R2C(33);
    R2B(34);
    R2A(35);
    R2E(36);
    R2D(37);
    R2C(38);
    R2B(39);
    R3A(40);
    R3E(41);
    R3D(42);
    R3C(43);
    R3B(44);
    R3A(45);
    R3E(46);
    R3D(47);
    R3C(48);
    R3B(49);
    R3A(50);
    R3E(51);
    R3D(52);
    R3C(53);
    R3B(54);
    R3A(55);
    R3E(56);
    R3D(57);
    R3C(58);
    R3B(59);
    R4A(60);
    R4E(61);
    R4D(62);
    R4C(63);
    R4B(64);
    R4A(65);
    R4E(66);
    R4D(67);
    R4C(68);
    R4B(69);
    R4A(70);
    R4E(71);
    R4D(72);
    R4C(73);
    R4B(74);
    R4A(75);
    R4E(76);
    R4D(77);
    R4C(78);
    R4B(79);

    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
}